

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGImpactShape.cpp
# Opt level: O3

void __thiscall
cbtGImpactMeshShapePart::calculateLocalInertia
          (cbtGImpactMeshShapePart *this,cbtScalar mass,cbtVector3 *inertia)

{
  undefined8 uVar1;
  int iVar2;
  PHY_ScalarType PVar3;
  uchar *puVar4;
  int iVar5;
  uint uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar14;
  undefined1 auVar15 [16];
  
  (*(this->super_cbtGImpactShapeInterface).super_cbtConcaveShape.super_cbtCollisionShape.
    _vptr_cbtCollisionShape[0x1c])();
  *(undefined1 (*) [16])inertia->m_floats = ZEXT816(0) << 0x40;
  iVar5 = (this->m_primitive_manager).numverts;
  if (iVar5 != 0) {
    iVar2 = (this->m_primitive_manager).stride;
    PVar3 = (this->m_primitive_manager).type;
    puVar4 = (this->m_primitive_manager).vertexbase;
    fVar10 = 0.0;
    uVar6 = (iVar5 + -1) * iVar2;
    fVar9 = mass / (float)iVar5;
    auVar7 = ZEXT816(0) << 0x40;
    do {
      auVar12 = ZEXT416((uint)(this->m_primitive_manager).m_scale.m_floats[0]);
      if (PVar3 == PHY_DOUBLE) {
        auVar12 = vinsertps_avx(auVar12,ZEXT416((uint)(this->m_primitive_manager).m_scale.m_floats
                                                      [1]),0x10);
        auVar12 = vcvtps2pd_avx(auVar12);
        auVar11._0_8_ = auVar12._0_8_ * *(double *)(puVar4 + uVar6);
        auVar11._8_8_ = auVar12._8_8_ * *(double *)((long)(puVar4 + uVar6) + 8);
        fVar14 = (float)((double)(this->m_primitive_manager).m_scale.m_floats[2] *
                        *(double *)(puVar4 + (ulong)uVar6 + 0x10));
        auVar12 = vcvtpd2ps_avx(auVar11);
      }
      else {
        auVar11 = vinsertps_avx(auVar12,ZEXT416((uint)(this->m_primitive_manager).m_scale.m_floats
                                                      [1]),0x10);
        auVar12._0_4_ = auVar11._0_4_ * (float)*(undefined8 *)(puVar4 + uVar6);
        auVar12._4_4_ = auVar11._4_4_ * (float)((ulong)*(undefined8 *)(puVar4 + uVar6) >> 0x20);
        auVar12._8_4_ = auVar11._8_4_ * 0.0;
        auVar12._12_4_ = auVar11._12_4_ * 0.0;
        fVar14 = *(float *)(puVar4 + (ulong)uVar6 + 8) *
                 (this->m_primitive_manager).m_scale.m_floats[2];
      }
      fVar14 = fVar14 * fVar14;
      auVar13._0_4_ = auVar12._0_4_ * auVar12._0_4_;
      auVar13._4_4_ = auVar12._4_4_ * auVar12._4_4_;
      auVar13._8_4_ = auVar12._8_4_ * auVar12._8_4_;
      auVar13._12_4_ = auVar12._12_4_ * auVar12._12_4_;
      uVar6 = uVar6 - iVar2;
      iVar5 = iVar5 + -1;
      auVar12 = vhaddps_avx(auVar13,auVar13);
      auVar15._0_4_ = fVar9 * (auVar13._0_4_ + fVar14);
      auVar15._4_4_ = fVar9 * (auVar13._4_4_ + fVar14);
      auVar15._8_4_ = fVar9 * (auVar13._8_4_ + fVar14);
      auVar15._12_4_ = fVar9 * (auVar13._12_4_ + fVar14);
      auVar11 = vshufps_avx(auVar15,auVar15,0xe1);
      auVar8._0_4_ = auVar7._0_4_ + auVar11._0_4_;
      auVar8._4_4_ = auVar7._4_4_ + auVar11._4_4_;
      auVar8._8_4_ = auVar7._8_4_ + auVar11._8_4_;
      auVar8._12_4_ = auVar7._12_4_ + auVar11._12_4_;
      fVar10 = fVar9 * auVar12._0_4_ + fVar10;
      uVar1 = vmovlps_avx(auVar8);
      *(undefined8 *)inertia->m_floats = uVar1;
      inertia->m_floats[2] = fVar10;
      auVar7 = auVar8;
    } while (iVar5 != 0);
  }
  (*(this->super_cbtGImpactShapeInterface).super_cbtConcaveShape.super_cbtCollisionShape.
    _vptr_cbtCollisionShape[0x1d])(this);
  return;
}

Assistant:

void cbtGImpactMeshShapePart::calculateLocalInertia(cbtScalar mass, cbtVector3& inertia) const
{
	lockChildShapes();

#ifdef CALC_EXACT_INERTIA
	inertia.setValue(0.f, 0.f, 0.f);

	int i = this->getVertexCount();
	cbtScalar pointmass = mass / cbtScalar(i);

	while (i--)
	{
		cbtVector3 pointintertia;
		this->getVertex(i, pointintertia);
		pointintertia = gim_get_point_inertia(pointintertia, pointmass);
		inertia += pointintertia;
	}

#else

	// Calc box inertia

	cbtScalar lx = m_localAABB.m_max[0] - m_localAABB.m_min[0];
	cbtScalar ly = m_localAABB.m_max[1] - m_localAABB.m_min[1];
	cbtScalar lz = m_localAABB.m_max[2] - m_localAABB.m_min[2];
	const cbtScalar x2 = lx * lx;
	const cbtScalar y2 = ly * ly;
	const cbtScalar z2 = lz * lz;
	const cbtScalar scaledmass = mass * cbtScalar(0.08333333);

	inertia = scaledmass * (cbtVector3(y2 + z2, x2 + z2, x2 + y2));

#endif

	unlockChildShapes();
}